

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPServer::getp_get_port
          (CVmObjHTTPServer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int port;
  char *ip;
  char *addr;
  vm_obj_id_t local_2c;
  char *local_28;
  char *local_20;
  
  if (getp_get_port(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_port();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_get_port::desc);
  if (iVar1 == 0) {
    iVar1 = get_listener_addr(this,&local_20,&local_28,(int *)&local_2c);
    if (iVar1 == 0) {
      retval->typ = VM_NIL;
    }
    else {
      retval->typ = VM_INT;
      (retval->val).obj = local_2c;
      lib_free_str(local_20);
      lib_free_str(local_28);
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPServer::getp_get_port(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* return the port number */
    char *addr, *ip;
    int port;
    if (get_listener_addr(addr, ip, port))
    {
        retval->set_int(port);
        lib_free_str(addr);
        lib_free_str(ip);
    }
    else
        retval->set_nil();

    /* handled */
    return TRUE;
}